

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_c1f395::cmMacroFunctionBlocker::Replay
          (cmMacroFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *status)

{
  cmMakefile *this_00;
  string *name;
  bool bVar1;
  cmState *this_01;
  cmMacroHelperCommand f;
  _Any_data local_1a8;
  code *local_198;
  code *pcStack_190;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_188;
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  undefined1 auStack_150 [24];
  undefined1 local_138 [40];
  _WordT _Stack_110;
  _WordT local_108;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  undefined8 uStack_e8;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  cmListFileContext local_a0;
  
  this_00 = status->Makefile;
  local_168._M_allocated_capacity = (size_type)(local_178 + 0x20);
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_178 + 0x10),"MACROS","");
  cmMakefile::AppendProperty
            (this_00,(string *)(local_178 + 0x10),
             (this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,false);
  if ((undefined1 *)local_168._M_allocated_capacity != local_178 + 0x20) {
    operator_delete((void *)local_168._M_allocated_capacity,(ulong)(local_158._M_p + 1));
  }
  local_108 = 0;
  local_138._32_8_ = 0;
  _Stack_110 = 0;
  local_138._16_8_ = 0;
  local_138._24_8_ = 0;
  local_138._0_8_ = 0;
  local_138._8_8_ = (pointer)0x0;
  auStack_150._8_8_ = 0;
  auStack_150._16_8_ = 0;
  local_158._M_p = (pointer)0x0;
  auStack_150._0_8_ = 0;
  local_168._M_allocated_capacity = 0;
  local_168._8_8_ = 0;
  local_f8 = 0;
  local_f0 = 0;
  local_100 = &local_f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_178 + 0x10),&this->Args);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::_M_move_assign
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)(local_178 + 0x28),
             functions);
  std::__cxx11::string::_M_assign((string *)&local_100);
  cmMakefile::RecordPolicies(this_00,(PolicyMap *)local_138);
  this_01 = cmMakefile::GetState(this_00);
  name = (this->Args).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_198 = (code *)0x0;
  pcStack_190 = (code *)0x0;
  local_1a8._M_unused._M_object = (void *)0x0;
  local_1a8._8_8_ = 0;
  local_1a8._M_unused._M_object = operator_new(0x88);
  *(size_type *)local_1a8._M_unused._0_8_ = local_168._M_allocated_capacity;
  *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 8) = local_168._8_8_;
  *(pointer *)((long)local_1a8._M_unused._0_8_ + 0x10) = local_158._M_p;
  local_158._M_p = (pointer)0x0;
  local_168._M_allocated_capacity = 0;
  local_168._8_8_ = 0;
  *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x18) = auStack_150._0_8_;
  *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x20) = auStack_150._8_8_;
  *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x28) = auStack_150._16_8_;
  auStack_150._16_8_ = 0;
  auStack_150._0_8_ = 0;
  auStack_150._8_8_ = 0;
  *(_WordT *)((long)local_1a8._M_unused._0_8_ + 0x60) = local_108;
  *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x50) = local_138._32_8_;
  *(_WordT *)((long)local_1a8._M_unused._0_8_ + 0x58) = _Stack_110;
  *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x40) = local_138._16_8_;
  *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x48) = local_138._24_8_;
  *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x30) = local_138._0_8_;
  ((_Alloc_hider *)((long)local_1a8._M_unused._0_8_ + 0x38))->_M_p = (pointer)local_138._8_8_;
  *(code **)((long)local_1a8._M_unused._0_8_ + 0x68) =
       (code *)((long)local_1a8._M_unused._0_8_ + 0x78);
  if (local_100 == &local_f0) {
    *(ulong *)((long)local_1a8._M_unused._0_8_ + 0x78) = CONCAT71(uStack_ef,local_f0);
    *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x80) = uStack_e8;
  }
  else {
    *(undefined1 **)((long)local_1a8._M_unused._0_8_ + 0x68) = local_100;
    *(ulong *)((long)local_1a8._M_unused._0_8_ + 0x78) = CONCAT71(uStack_ef,local_f0);
  }
  *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x70) = local_f8;
  local_f8 = 0;
  local_f0 = 0;
  pcStack_190 = std::
                _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmMacroHelperCommand>
                ::_M_invoke;
  local_198 = std::
              _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmMacroHelperCommand>
              ::_M_manager;
  local_100 = &local_f0;
  cmMakefile::GetBacktrace(this_00);
  cmListFileContext::cmListFileContext(&local_a0,&(this->super_cmFunctionBlocker).StartingContext);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            (&local_188,(cmListFileContext *)local_178);
  local_d8._M_unused._M_object = (undefined8 *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (code *)0x0;
  local_c0 = pcStack_190;
  if (local_198 != (code *)0x0) {
    local_d8._M_unused._M_function_pointer = (_func_void *)local_1a8._M_unused._0_8_;
    local_d8._8_8_ = local_1a8._8_8_;
    local_c8 = local_198;
    local_198 = (code *)0x0;
    pcStack_190 = (code *)0x0;
  }
  local_b8 = local_188.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  p_Stack_b0 = local_188.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  local_188.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_188.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar1 = cmState::AddScriptedCommand
                    (this_01,name,
                     (BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
                      *)&local_d8,this_00);
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (local_188.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_a0.DeferId.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    local_a0.DeferId.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    if (local_a0.DeferId.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p !=
        ((pointer)
        ((long)&local_a0.DeferId.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        + 0x10U))._M_p) {
      operator_delete((void *)local_a0.DeferId.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      local_a0.DeferId.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.FilePath._M_dataplus._M_p != &local_a0.FilePath.field_2) {
    operator_delete(local_a0.FilePath._M_dataplus._M_p,
                    local_a0.FilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.Name._M_dataplus._M_p != &local_a0.Name.field_2) {
    operator_delete(local_a0.Name._M_dataplus._M_p,local_a0.Name.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
  }
  if (local_198 != (code *)0x0) {
    (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)(local_178 + 0x28));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_178 + 0x10));
  return bVar1;
}

Assistant:

bool cmMacroFunctionBlocker::Replay(std::vector<cmListFileFunction> functions,
                                    cmExecutionStatus& status)
{
  cmMakefile& mf = status.GetMakefile();
  mf.AppendProperty("MACROS", this->Args[0]);
  // create a new command and add it to cmake
  cmMacroHelperCommand f;
  f.Args = this->Args;
  f.Functions = std::move(functions);
  f.FilePath = this->GetStartingContext().FilePath;
  mf.RecordPolicies(f.Policies);
  return mf.GetState()->AddScriptedCommand(
    this->Args[0],
    BT<cmState::Command>(std::move(f),
                         mf.GetBacktrace().Push(this->GetStartingContext())),
    mf);
}